

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O3

void __thiscall
DatabaseSnapshot::internal_compact
          (DatabaseSnapshot *this,Task *task,
          vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *datasets)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer ppOVar2;
  string *__x;
  pointer ppOVar3;
  size_type __n;
  char *__end;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *__range1;
  string dataset_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ds_names;
  string local_1d8;
  DbChangeType local_1b4;
  Task *local_1b0;
  string local_1a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_188;
  Task *local_168;
  DatabaseName local_160;
  DBChange local_c0;
  DBChange local_78;
  
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_188.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __n = (long)(datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish -
        (long)(datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_start >> 3;
  if (1 < __n) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&local_188,__n);
    ppOVar3 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar3 != ppOVar2) {
      do {
        __x = OnDiskDataset::get_name_abi_cxx11_(*ppOVar3);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&local_188,__x);
        ppOVar3 = ppOVar3 + 1;
      } while (ppOVar3 != ppOVar2);
    }
    local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"set","");
    allocate_name(&local_160,this,&local_1d8);
    local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1a8,local_160.filename._M_dataplus._M_p,
               local_160.filename._M_dataplus._M_p + local_160.filename._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.filename._M_dataplus._M_p != &local_160.filename.field_2) {
      operator_delete(local_160.filename._M_dataplus._M_p,
                      local_160.filename.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.id._M_dataplus._M_p != &local_160.id.field_2) {
      operator_delete(local_160.id._M_dataplus._M_p,local_160.id.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.type._M_dataplus._M_p != &local_160.type.field_2) {
      operator_delete(local_160.type._M_dataplus._M_p,
                      local_160.type.field_2._M_allocated_capacity + 1);
    }
    std::experimental::filesystem::v1::__cxx11::path::~path(&local_160.db_base);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
      operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
    }
    local_1b0 = task;
    OnDiskDataset::merge(&this->db_base,&local_1a8,datasets,*(TaskSpec **)task);
    ppOVar3 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_start;
    ppOVar2 = (datasets->
              super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppOVar3 != ppOVar2) {
      local_168 = local_1b0 + 8;
      do {
        local_1b4 = Drop;
        OnDiskDataset::get_id_abi_cxx11_((string *)&local_160,*ppOVar3);
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"","");
        DBChange::DBChange(&local_c0,&local_1b4,(string *)&local_160,&local_1d8);
        std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                  ((vector<DBChange,_std::allocator<DBChange>_> *)local_168,&local_c0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.parameter._M_dataplus._M_p != &local_c0.parameter.field_2) {
          operator_delete(local_c0.parameter._M_dataplus._M_p,
                          local_c0.parameter.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c0.obj_name._M_dataplus._M_p != &local_c0.obj_name.field_2) {
          operator_delete(local_c0.obj_name._M_dataplus._M_p,
                          local_c0.obj_name.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160.db_base._M_pathname._M_dataplus._M_p !=
            &local_160.db_base._M_pathname.field_2) {
          operator_delete(local_160.db_base._M_pathname._M_dataplus._M_p,
                          local_160.db_base._M_pathname.field_2._M_allocated_capacity + 1);
        }
        ppOVar3 = ppOVar3 + 1;
      } while (ppOVar3 != ppOVar2);
    }
    local_1d8._M_dataplus._M_p._0_4_ = 1;
    paVar1 = &local_160.db_base._M_pathname.field_2;
    local_160.db_base._M_pathname._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"");
    DBChange::DBChange(&local_78,(DbChangeType *)&local_1d8,&local_1a8,(string *)&local_160);
    std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
              ((vector<DBChange,_std::allocator<DBChange>_> *)(local_1b0 + 8),&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.parameter._M_dataplus._M_p != &local_78.parameter.field_2) {
      operator_delete(local_78.parameter._M_dataplus._M_p,
                      local_78.parameter.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78.obj_name._M_dataplus._M_p != &local_78.obj_name.field_2) {
      operator_delete(local_78.obj_name._M_dataplus._M_p,
                      local_78.obj_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160.db_base._M_pathname._M_dataplus._M_p != paVar1) {
      operator_delete(local_160.db_base._M_pathname._M_dataplus._M_p,
                      local_160.db_base._M_pathname.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
      operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_188);
  return;
}

Assistant:

void DatabaseSnapshot::internal_compact(
    Task *task, const std::vector<const OnDiskDataset *> &datasets) const {
    std::vector<std::string> ds_names;

    // There's nothing to compact
    if (datasets.size() < 2) {
        return;
    }

    ds_names.reserve(datasets.size());
    for (const auto *ds : datasets) {
        ds_names.push_back(ds->get_name());
    }

    std::string dataset_name = allocate_name().get_filename();
    OnDiskDataset::merge(db_base, dataset_name, datasets, &task->spec());

    for (auto &dataset : datasets) {
        task->change(DBChange(DbChangeType::Drop, dataset->get_id()));
    }

    task->change(DBChange(DbChangeType::Insert, dataset_name));
}